

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O0

int __thiscall IlmThread_3_4::Semaphore::value(Semaphore *this)

{
  int iVar1;
  long in_RDI;
  int value;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  iVar1 = sem_getvalue((sem_t *)(in_RDI + 8),(int *)&stack0xfffffffffffffff4);
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    Iex_3_4::throwErrnoExc(local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return in_stack_fffffffffffffff4;
}

Assistant:

int
Semaphore::value () const
{
    int value;

    if (::sem_getvalue (&_semaphore, &value))
        IEX_NAMESPACE::throwErrnoExc ("Cannot read semaphore value (%T).");

    return value;
}